

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

FT_Error t1_set_mm_blend(T1_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  uint uVar1;
  uint uVar2;
  PS_Blend pPVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  pPVar3 = face->blend;
  if (pPVar3 == (PS_Blend)0x0) {
    return 6;
  }
  uVar1 = pPVar3->num_designs;
  uVar2 = pPVar3->num_axis;
  uVar6 = 0;
  bVar4 = false;
  do {
    if (uVar6 == uVar1) {
      return -(uint)!bVar4;
    }
    lVar7 = 0x10000;
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      if (uVar8 < num_coords) {
        uVar5 = 0x10000 - coords[uVar8];
        if (((uint)uVar6 >> ((uint)uVar8 & 0x1f) & 1) != 0) {
          uVar5 = coords[uVar8];
        }
        if ((long)uVar5 < 1) {
          lVar7 = 0;
          break;
        }
        if (uVar5 < 0x10000) {
          lVar7 = (long)(int)(((long)(uVar5 * lVar7) >> 0x3f) + uVar5 * lVar7 + 0x8000 >> 0x10);
        }
      }
      else {
        lVar7 = lVar7 >> 1;
      }
    }
    if (pPVar3->weight_vector[uVar6] != lVar7) {
      pPVar3->weight_vector[uVar6] = lVar7;
      bVar4 = true;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static FT_Error
  t1_set_mm_blend( T1_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords )
  {
    PS_Blend  blend = face->blend;
    FT_UInt   n, m;

    FT_Bool  have_diff = 0;


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    if ( num_coords > blend->num_axis )
      num_coords = blend->num_axis;

    /* recompute the weight vector from the blend coordinates */
    for ( n = 0; n < blend->num_designs; n++ )
    {
      FT_Fixed  result = 0x10000L;  /* 1.0 fixed */
      FT_Fixed  factor;


      for ( m = 0; m < blend->num_axis; m++ )
      {
        /* use a default value if we don't have a coordinate */
        if ( m >= num_coords )
        {
          result >>= 1;
          continue;
        }

        /* get current blend axis position */
        factor = coords[m];
        if ( ( n & ( 1 << m ) ) == 0 )
          factor = 0x10000L - factor;

        if ( factor <= 0 )
        {
          result = 0;
          break;
        }
        else if ( factor >= 0x10000L )
          continue;

        result = FT_MulFix( result, factor );
      }

      if ( blend->weight_vector[n] != result )
      {
        blend->weight_vector[n] = result;
        have_diff               = 1;
      }
    }

    /* return value -1 indicates `no change' */
    return have_diff ? FT_Err_Ok : -1;
  }